

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int vdbePmaWriterFinish(PmaWriter *p,i64 *piEof)

{
  int iVar1;
  
  if ((p->eFWErr == 0) && (p->aBuffer != (u8 *)0x0)) {
    iVar1 = p->iBufStart;
    if (iVar1 < p->iBufEnd) {
      iVar1 = (*p->pFd->pMethods->xWrite)
                        (p->pFd,p->aBuffer + iVar1,p->iBufEnd - iVar1,(long)iVar1 + p->iWriteOff);
      p->eFWErr = iVar1;
    }
  }
  *piEof = (long)p->iBufEnd + p->iWriteOff;
  sqlite3_free(p->aBuffer);
  p->nBuffer = 0;
  p->iBufStart = 0;
  *(undefined8 *)&p->iBufEnd = 0;
  p->iWriteOff = 0;
  p->pFd = (sqlite3_file *)0x0;
  *(undefined8 *)p = 0;
  p->aBuffer = (u8 *)0x0;
  return p->eFWErr;
}

Assistant:

static int vdbePmaWriterFinish(PmaWriter *p, i64 *piEof){
  int rc;
  if( p->eFWErr==0 && ALWAYS(p->aBuffer) && p->iBufEnd>p->iBufStart ){
    p->eFWErr = sqlite3OsWrite(p->pFd,
        &p->aBuffer[p->iBufStart], p->iBufEnd - p->iBufStart,
        p->iWriteOff + p->iBufStart
    );
  }
  *piEof = (p->iWriteOff + p->iBufEnd);
  sqlite3_free(p->aBuffer);
  rc = p->eFWErr;
  memset(p, 0, sizeof(PmaWriter));
  return rc;
}